

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O2

void helper_mttc0_status_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint32_t tc;
  
  if ((env->CP0_VPEConf0 & 2) == 0) {
    tc = env->current_tc;
  }
  else {
    tc = (uint32_t)
         ((long)(ulong)(byte)env->CP0_VPEControl % (long)*(int *)((long)env[-3].tcs[0xc].gpr + 0x94)
         );
  }
  env->CP0_Status =
       env->CP0_Status_rw_bitmask & ((uint)arg1 ^ env->CP0_Status) & 0xeffffe7 ^ env->CP0_Status;
  sync_c0_status_mips64(env,env,tc);
  return;
}

Assistant:

void helper_mttc0_status(CPUMIPSState *env, target_ulong arg1)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    uint32_t mask = env->CP0_Status_rw_bitmask & ~0xf1000018;
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    other->CP0_Status = (other->CP0_Status & ~mask) | (arg1 & mask);
    sync_c0_status(env, other, other_tc);
}